

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTChannel.cpp
# Opt level: O2

void LTACMasterdataChannel::UnregisterMasterDataChn(LTACMasterdataChannel *pChn)

{
  LTACMasterdataChannel *pChn_local;
  
  pChn_local = pChn;
  std::recursive_mutex::lock(&mtxMaster);
  std::__cxx11::list<LTACMasterdataChannel_*,_std::allocator<LTACMasterdataChannel_*>_>::remove
            (&lstChn_abi_cxx11_,(char *)&pChn_local);
  pthread_mutex_unlock((pthread_mutex_t *)&mtxMaster);
  return;
}

Assistant:

void LTACMasterdataChannel::UnregisterMasterDataChn (LTACMasterdataChannel* pChn)
{
    try {
        std::lock_guard<std::recursive_mutex> lock (mtxMaster);
        // just remove the channel
        lstChn.remove(pChn);
    } catch(const std::system_error& e) {
        LOG_MSG(logERR, ERR_LOCK_ERROR, "mtxMaster", e.what());
    }
}